

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall Js::InterpreterStackFrame::Process(InterpreterStackFrame *this)

{
  code *pcVar1;
  bool bVar2;
  ExecutionMode EVar3;
  Which WVar4;
  uint uVar5;
  LocalFunctionId LVar6;
  FunctionBody *pFVar7;
  AsmJsModuleInfo *pAVar8;
  undefined4 *puVar9;
  char16 *pcVar10;
  wchar local_138 [4];
  char16 debugStringBuffer_1 [42];
  wchar local_d8 [4];
  char16 debugStringBuffer [42];
  InterpreterStackFrame *local_78;
  Var result;
  ExecutionMode interpreterExecutionMode;
  FunctionBody *functionBody;
  InterpreterStackFrame *local_58;
  Var returnVar;
  AsmJsFunctionInfo *asmInfo;
  FunctionBody *functionBody_1;
  EHBailoutData *topLevelEHBailoutData;
  undefined1 local_28 [8];
  AutoRestore autoRestore;
  InterpreterStackFrame *this_local;
  
  autoRestore._8_8_ = this;
  Process()::AutoRestore::AutoRestore(Js::InterpreterStackFrame__(local_28,this);
  if ((((*(long *)(this + 0x150) != 0) && (bVar2 = TestFlags(this,0x40), !bVar2)) &&
      (bVar2 = TestFlags(this,8), bVar2)) && (bVar2 = TestFlags(this,0x20), !bVar2)) {
    OrFlags(this,0x20);
    functionBody_1 = *(FunctionBody **)(this + 0x150);
    while (*(int *)&((functionBody_1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                    ptr)->originalEntryPoint != -1) {
      *(FunctionBody **)
       &((functionBody_1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        attributes = functionBody_1;
      functionBody_1 =
           (FunctionBody *)
           (functionBody_1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    ProcessTryHandlerBailout(this,(EHBailoutData *)functionBody_1,**(uint32 **)(this + 0x150));
    ClearFlags(this,0x20);
    *(undefined8 *)(this + 0x150) = 0;
  }
  pFVar7 = GetFunctionBody(this);
  bVar2 = ParseableFunctionInfo::GetIsAsmjsMode(&pFVar7->super_ParseableFunctionInfo);
  if (bVar2) {
    asmInfo = (AsmJsFunctionInfo *)GetFunctionBody(this);
    returnVar = FunctionBody::GetAsmJsFunctionInfo((FunctionBody *)asmInfo);
    if ((AsmJsFunctionInfo *)returnVar == (AsmJsFunctionInfo *)0x0) {
      pAVar8 = FunctionBody::GetAsmJsModuleInfo((FunctionBody *)asmInfo);
      if (pAVar8 == (AsmJsModuleInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xd7a,"(functionBody->GetAsmJsModuleInfo())",
                                    "functionBody->GetAsmJsModuleInfo()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      this_local = (InterpreterStackFrame *)ProcessAsmJsModule(this);
    }
    else {
      AlignMemoryForAsmJs(this);
      local_58 = (InterpreterStackFrame *)ProcessAsmJs(this);
      uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)asmInfo);
      LVar6 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)asmInfo);
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,AsmjsFunctionEntryPhase,uVar5,LVar6);
      if (bVar2) {
        AsmJsCallDepth = AsmJsCallDepth - 1;
        if (AsmJsCallDepth == 0) {
          Output::Print(L"}");
        }
        else {
          Output::Print(L"%*c}",(ulong)AsmJsCallDepth,0x20);
        }
        functionBody._4_4_ = AsmJsFunctionInfo::GetReturnType((AsmJsFunctionInfo *)returnVar);
        WVar4 = AsmJsRetType::which((AsmJsRetType *)((long)&functionBody + 4));
        switch(WVar4) {
        case Int64:
          Output::Print(L" = %lld",**(undefined8 **)(this + 0x120));
          break;
        case Double:
          Output::Print(L" = %.4f",**(undefined8 **)(this + 0x128));
          break;
        case Float:
          Output::Print(L" = %.4f",(double)**(float **)(this + 0x130));
          break;
        default:
          break;
        case Signed:
          Output::Print(L" = %d",(ulong)**(uint **)(this + 0x118));
          break;
        case Void:
        }
        Output::Print(L";\n");
        Output::Flush();
      }
      this_local = local_58;
    }
  }
  else {
    this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] & 0xf7);
    *(undefined4 *)(this + 0xd8) = 0xffffffff;
    pFVar7 = GetFunctionBody(this);
    bVar2 = TestFlags(this,8);
    EVar3 = FunctionBody::GetInterpreterExecutionMode(pFVar7,bVar2);
    if (EVar3 == ProfilingInterpreter) {
      bVar2 = ScriptContext::ShouldPerformRecordOrReplayDebuggerAction
                        (*(ScriptContext **)(this + 0x78));
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xd8c,
                                    "(!((this->scriptContext)->ShouldPerformRecordOrReplayDebuggerAction()))"
                                    ,"We should have pinned into Interpreter mode in this case!!!");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] & 0xef);
      this_local = (InterpreterStackFrame *)ProcessProfiled(this);
    }
    else {
      if ((EVar3 != Interpreter) && (EVar3 != AutoProfilingInterpreter)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xd95,
                                    "(interpreterExecutionMode == ExecutionMode::Interpreter || interpreterExecutionMode == ExecutionMode::AutoProfilingInterpreter)"
                                    ,
                                    "interpreterExecutionMode == ExecutionMode::Interpreter || interpreterExecutionMode == ExecutionMode::AutoProfilingInterpreter"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      this[0xd6] = (InterpreterStackFrame)
                   ((byte)this[0xd6] & 0xef | (EVar3 == AutoProfilingInterpreter) << 4);
      while( true ) {
        if (((byte)this[0xd6] >> 3 & 1) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0xd9b,"(!switchProfileMode)","!switchProfileMode");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        local_78 = (InterpreterStackFrame *)ProcessUnprofiled(this);
        if ((((byte)this[0xd6] >> 3 & 1) != 0) && (local_78 != (InterpreterStackFrame *)0x0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0xdaa,"(!(switchProfileMode && result))",
                                      "!(switchProfileMode && result)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        if (((byte)this[0xd6] >> 3 & 1) == 0) break;
        this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] & 0xf7);
        if (((byte)this[0xd6] >> 4 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0xdb3,"(isAutoProfiling)","isAutoProfiling");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
        LVar6 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
        bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InterpreterAutoProfilePhase,uVar5,LVar6);
        if (bVar2) {
          pcVar10 = FunctionProxy::GetDebugNumberSet
                              ((FunctionProxy *)pFVar7,(wchar (*) [42])local_d8);
          Output::Print(L"InterpreterAutoProfile - Func %s - Started profiling\n",pcVar10);
          Output::Flush();
        }
        if (((byte)this[0xd6] >> 3 & 1) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0xdbf,"(!switchProfileMode)","!switchProfileMode");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        local_78 = (InterpreterStackFrame *)ProcessProfiled(this);
        if ((((byte)this[0xd6] >> 3 & 1) != 0) && (local_78 != (InterpreterStackFrame *)0x0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0xdc1,"(!(switchProfileMode && result))",
                                      "!(switchProfileMode && result)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        if (((byte)this[0xd6] >> 3 & 1) == 0) break;
        this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] & 0xf7);
        if (((byte)this[0xd6] >> 4 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0xdca,"(isAutoProfiling)","isAutoProfiling");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
        LVar6 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
        bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InterpreterAutoProfilePhase,uVar5,LVar6);
        if (bVar2) {
          pcVar10 = FunctionProxy::GetDebugNumberSet
                              ((FunctionProxy *)pFVar7,(wchar (*) [42])local_138);
          Output::Print(L"InterpreterAutoProfile - Func %s - Stopped profiling\n",pcVar10);
          Output::Flush();
        }
      }
      this_local = local_78;
    }
  }
  functionBody._0_4_ = 1;
  Process::AutoRestore::~AutoRestore((AutoRestore *)local_28);
  return this_local;
}

Assistant:

Var InterpreterStackFrame::Process()
    {
#if ENABLE_PROFILE_INFO
        class AutoRestore
        {
        private:
            InterpreterStackFrame * const interpreterStackFrame;
            const uint32 savedSwitchProfileModeOnLoopEndNumber;
            const bool savedIsAutoProfiling;
            const bool savedSwitchProfileMode;

        public:
            AutoRestore(InterpreterStackFrame *const interpreterStackFrame)
                : interpreterStackFrame(interpreterStackFrame),
                savedIsAutoProfiling(interpreterStackFrame->isAutoProfiling),
                savedSwitchProfileMode(interpreterStackFrame->switchProfileMode),
                savedSwitchProfileModeOnLoopEndNumber(interpreterStackFrame->switchProfileModeOnLoopEndNumber)
            {
            }

            ~AutoRestore()
            {
                interpreterStackFrame->isAutoProfiling = savedIsAutoProfiling;
                interpreterStackFrame->switchProfileMode = savedSwitchProfileMode;
                interpreterStackFrame->switchProfileModeOnLoopEndNumber = savedSwitchProfileModeOnLoopEndNumber;
            }
        } autoRestore(this);
#endif

        if (this->ehBailoutData && !this->TestFlags(InterpreterStackFrameFlags_FromBailOutInInlinee))
        {
            if (this->TestFlags(Js::InterpreterStackFrameFlags_FromBailOut) && !this->TestFlags(InterpreterStackFrameFlags_ProcessingBailOutFromEHCode))
            {
                this->OrFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutFromEHCode);
                EHBailoutData * topLevelEHBailoutData = this->ehBailoutData;
                while (topLevelEHBailoutData->parent->nestingDepth != -1)
                {
                    topLevelEHBailoutData->parent->child = topLevelEHBailoutData;
                    topLevelEHBailoutData = topLevelEHBailoutData->parent;
                }
                ProcessTryHandlerBailout(topLevelEHBailoutData, this->ehBailoutData->nestingDepth);
                this->ClearFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutFromEHCode);
                this->ehBailoutData = nullptr;
            }
        }

#ifdef ASMJS_PLAT
        if (GetFunctionBody()->GetIsAsmjsMode())
        {
            FunctionBody *const functionBody = GetFunctionBody();
            AsmJsFunctionInfo* asmInfo = functionBody->GetAsmJsFunctionInfo();
            if (asmInfo)
            {
                AlignMemoryForAsmJs();
                Var returnVar = ProcessAsmJs();
#if ENABLE_DEBUG_CONFIG_OPTIONS
                if (PHASE_TRACE(AsmjsFunctionEntryPhase, functionBody))
                {
                    --AsmJsCallDepth;
                    if (AsmJsCallDepth)
                    {
                        Output::Print(_u("%*c}"), AsmJsCallDepth, ' ');
                    }
                    else
                    {
                        Output::Print(_u("}"));
                    }
                    switch (asmInfo->GetReturnType().which())
                    {
                    case AsmJsRetType::Void:
                        break;
                    case AsmJsRetType::Signed:
                        Output::Print(_u(" = %d"), m_localIntSlots[0]);
                        break;
                    case AsmJsRetType::Int64:
                        Output::Print(_u(" = %lld"), m_localInt64Slots[0]);
                        break;
                    case AsmJsRetType::Float:
                        Output::Print(_u(" = %.4f"), m_localFloatSlots[0]);
                        break;
                    case AsmJsRetType::Double:
                        Output::Print(_u(" = %.4f"), m_localDoubleSlots[0]);
                        break;
                    default:
                        break;
                    }
                    Output::Print(_u(";\n"));
                    Output::Flush();
                }
#endif
                return returnVar;
            }
            else
            {
                Assert(functionBody->GetAsmJsModuleInfo());
                return ProcessAsmJsModule();
            }
        }
#endif

#if ENABLE_PROFILE_INFO
        switchProfileMode = false;
        switchProfileModeOnLoopEndNumber = 0u - 1;
#endif

#if ENABLE_PROFILE_INFO
        FunctionBody *const functionBody = GetFunctionBody();
        const ExecutionMode interpreterExecutionMode =
            functionBody->GetInterpreterExecutionMode(TestFlags(InterpreterStackFrameFlags_FromBailOut));
        if (interpreterExecutionMode == ExecutionMode::ProfilingInterpreter)
        {
#if ENABLE_TTD
            AssertMsg(!SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext), "We should have pinned into Interpreter mode in this case!!!");
#endif

            isAutoProfiling = false;
            return ProcessProfiled();
        }

        Assert(
            interpreterExecutionMode == ExecutionMode::Interpreter ||
            interpreterExecutionMode == ExecutionMode::AutoProfilingInterpreter);
        isAutoProfiling = interpreterExecutionMode == ExecutionMode::AutoProfilingInterpreter;

        Var result;
        while (true)
        {
            Assert(!switchProfileMode);

#if ENABLE_TTD_DIAGNOSTICS_TRACING
            if (this->scriptContext->ShouldPerformRecordOrReplayAction())
            {
                result = ProcessUnprofiled_PreviousStmtTracking();
            }
            else
            {
                result = ProcessUnprofiled();
            }
#else
            result = ProcessUnprofiled();
#endif

            Assert(!(switchProfileMode && result));
            if (switchProfileMode)
            {
                switchProfileMode = false;
            }
            else
            {
                break;
            }
            Assert(isAutoProfiling);

#if DBG_DUMP

            if (PHASE_TRACE(InterpreterAutoProfilePhase, functionBody))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("InterpreterAutoProfile - Func %s - Started profiling\n"), functionBody->GetDebugNumberSet(debugStringBuffer));
                Output::Flush();
            }
#endif

            Assert(!switchProfileMode);
            result = ProcessProfiled();
            Assert(!(switchProfileMode && result));
            if (switchProfileMode)
            {
                switchProfileMode = false;
            }
            else
            {
                break;
            }
            Assert(isAutoProfiling);

#if DBG_DUMP
            if (PHASE_TRACE(InterpreterAutoProfilePhase, functionBody))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("InterpreterAutoProfile - Func %s - Stopped profiling\n"), functionBody->GetDebugNumberSet(debugStringBuffer));
                Output::Flush();
            }
#endif
        }
        return result;
#else
#if ENABLE_TTD_DIAGNOSTICS_TRACING
        if (this->scriptContext->ShouldPerformRecordOrReplayAction())
        {
            return ProcessUnprofiled_PreviousStmtTracking();
        }
        else
        {
            return ProcessUnprofiled();
        }
#else
        return ProcessUnprofiled();
#endif
#endif
    }